

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

void __thiscall toml::failure<toml::error_info>::~failure(failure<toml::error_info> *this)

{
  error_info::~error_info(&this->value);
  return;
}

Assistant:

~failure() = default;